

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O1

optional<kernel::CCoinsStats> * __thiscall
kernel::ComputeUTXOStats
          (optional<kernel::CCoinsStats> *__return_storage_ptr__,kernel *this,
          CoinStatsHashType hash_type,CCoinsView *view,BlockManager *blockman,
          function<void_()> *interruption_point)

{
  uint256 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar4;
  char cVar5;
  CBlockIndex *args;
  CBlockIndex **ppCVar6;
  mapped_type *pmVar7;
  long lVar8;
  undefined4 in_register_00000014;
  long *plVar9;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_00;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_01;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_02;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_03;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_04;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_05;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_06;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_07;
  int iVar10;
  CSHA256 *pCVar11;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *hash;
  Txid *hash_00;
  undefined8 *puVar12;
  char *pcVar13;
  CScript *pCVar14;
  long in_FS_OFFSET;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  CBlockIndex *pindex;
  unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_> pcursor;
  CCoinsStats stats;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  outputs_2;
  uint256 out;
  COutPoint key;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  outputs;
  Txid prevkey;
  long *plVar22;
  long *local_7c0;
  undefined1 local_7b8 [80];
  uchar local_768 [8];
  uchar auStack_760 [8];
  uint64_t local_758;
  uint64_t local_740;
  undefined1 local_6e8 [36];
  size_type sStack_6c4;
  uchar auStack_6c0 [8];
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [16];
  undefined1 local_698 [16];
  uint64_t local_688;
  undefined1 local_3e8 [16];
  _Base_ptr local_3d8;
  _Base_ptr p_Stack_3d0;
  _Base_ptr local_3c8;
  limb_t local_3c0;
  undefined1 local_e8 [36];
  uint local_c4;
  undefined4 local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  key_type_conflict3 local_98 [4];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  _Base_ptr local_68;
  size_t local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  plVar9 = (long *)CONCAT44(in_register_00000014,hash_type);
  bVar15 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_6e8._9_7_ = SUB87(local_6e8._0_8_,1);
  local_6e8._0_9_ = ZEXT89(0x13e7538);
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_6e8);
  (**(code **)(*plVar9 + 0x10))(local_3e8,plVar9);
  args = ::node::BlockManager::LookupBlockIndex((BlockManager *)view,(uint256 *)local_3e8);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_6e8);
  pcVar13 = "pindex";
  ppCVar6 = inline_assertion_check<true,CBlockIndex*&>
                      ((CBlockIndex **)&stack0xfffffffffffff838,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/coinstats.cpp"
                       ,0x9d,"ComputeUTXOStats","pindex");
  puVar1 = args->phashBlock;
  if (puVar1 == (uint256 *)0x0) {
    __assert_fail("phashBlock != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                  ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
  }
  local_3e8._0_8_ = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
  local_3e8._8_8_ = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
  local_3d8 = *(_Base_ptr *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
  p_Stack_3d0 = *(_Base_ptr *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
  CCoinsStats::CCoinsStats((CCoinsStats *)local_7b8,(*ppCVar6)->nHeight,(uint256 *)local_3e8);
  iVar10 = (int)this;
  if (iVar10 == 2) {
    (**(code **)(*plVar9 + 0x28))(local_b8,plVar9);
    if (local_b8._0_8_ == 0) {
      pcVar13 = 
      "bool kernel::ComputeUTXOStats(CCoinsView *, CCoinsStats &, T, const std::function<void ()> &) [T = std::nullptr_t]"
      ;
      goto LAB_008ca000;
    }
    local_e8[0x10] = '\0';
    local_e8[0x11] = '\0';
    local_e8[0x12] = '\0';
    local_e8[0x13] = '\0';
    local_e8[0x14] = '\0';
    local_e8[0x15] = '\0';
    local_e8[0x16] = '\0';
    local_e8[0x17] = '\0';
    local_e8[0x18] = '\0';
    local_e8[0x19] = '\0';
    local_e8[0x1a] = '\0';
    local_e8[0x1b] = '\0';
    local_e8[0x1c] = '\0';
    local_e8[0x1d] = '\0';
    local_e8[0x1e] = '\0';
    local_e8[0x1f] = '\0';
    local_e8._0_16_ = (undefined1  [16])0x0;
    p_Stack_3d0 = (_Base_ptr)(local_3e8 + 8);
    local_3e8._8_8_ = local_3e8._8_8_ & 0xffffffff00000000;
    local_3d8 = (_Base_ptr)0x0;
    local_3c0 = 0;
    local_3c8 = p_Stack_3d0;
    while( true ) {
      cVar4 = (**(code **)(*(long *)local_b8._0_8_ + 0x20))();
      if (cVar4 == '\0') break;
      if (*(long *)((long)&(blockman->cs_LastBlockFile).super_recursive_mutex.
                           super___recursive_mutex_base._M_mutex + 0x10) != 0) {
        (**(code **)((long)&(blockman->cs_LastBlockFile).super_recursive_mutex.
                            super___recursive_mutex_base._M_mutex + 0x18))(blockman);
      }
      local_78 = (undefined1  [16])0x0;
      local_88 = (undefined1  [16])0x0;
      local_68 = (_Base_ptr)CONCAT44(local_68._4_4_,0xffffffff);
      CTxOut::CTxOut((CTxOut *)local_6e8);
      auStack_6c0[0] = '\0';
      auStack_6c0[1] = '\0';
      auStack_6c0[2] = '\0';
      auStack_6c0[3] = '\0';
      cVar5 = (**(code **)(*(long *)local_b8._0_8_ + 0x10))(local_b8._0_8_,local_88);
      iVar10 = (int)pcVar13;
      if (cVar5 == '\0') {
LAB_008c9d25:
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/coinstats.cpp"
        ;
        source_file_00._M_len = 0x5d;
        logging_function_00._M_str = "ComputeUTXOStats";
        logging_function_00._M_len = 0x10;
        LogPrintf_<char[17]>
                  (logging_function_00,source_file_00,iVar10,(LogFlags)interruption_point,
                   (Level)plVar9,(char *)__return_storage_ptr__,(char (*) [17])args);
        if (0x1c < sStack_6c4) {
          free((void *)local_6e8._8_8_);
          local_6e8._8_8_ = 0;
        }
        goto LAB_008c9e72;
      }
      cVar5 = (**(code **)(*(long *)local_b8._0_8_ + 0x18))(local_b8._0_8_,(CTxOut *)local_6e8);
      iVar10 = (int)pcVar13;
      if (cVar5 == '\0') goto LAB_008c9d25;
      if (local_3c0 != 0) {
        auVar21[0] = -(local_78[0] == local_e8[0x10]);
        auVar21[1] = -(local_78[1] == local_e8[0x11]);
        auVar21[2] = -(local_78[2] == local_e8[0x12]);
        auVar21[3] = -(local_78[3] == local_e8[0x13]);
        auVar21[4] = -(local_78[4] == local_e8[0x14]);
        auVar21[5] = -(local_78[5] == local_e8[0x15]);
        auVar21[6] = -(local_78[6] == local_e8[0x16]);
        auVar21[7] = -(local_78[7] == local_e8[0x17]);
        auVar21[8] = -(local_78[8] == local_e8[0x18]);
        auVar21[9] = -(local_78[9] == local_e8[0x19]);
        auVar21[10] = -(local_78[10] == local_e8[0x1a]);
        auVar21[0xb] = -(local_78[0xb] == local_e8[0x1b]);
        auVar21[0xc] = -(local_78[0xc] == local_e8[0x1c]);
        auVar21[0xd] = -(local_78[0xd] == local_e8[0x1d]);
        auVar21[0xe] = -(local_78[0xe] == local_e8[0x1e]);
        auVar21[0xf] = -(local_78[0xf] == local_e8[0x1f]);
        auVar18[0] = -(local_88[0] == local_e8[0]);
        auVar18[1] = -(local_88[1] == local_e8[1]);
        auVar18[2] = -(local_88[2] == local_e8[2]);
        auVar18[3] = -(local_88[3] == local_e8[3]);
        auVar18[4] = -(local_88[4] == local_e8[4]);
        auVar18[5] = -(local_88[5] == local_e8[5]);
        auVar18[6] = -(local_88[6] == local_e8[6]);
        auVar18[7] = -(local_88[7] == local_e8[7]);
        auVar18[8] = -(local_88[8] == local_e8[8]);
        auVar18[9] = -(local_88[9] == local_e8[9]);
        auVar18[10] = -(local_88[10] == local_e8[10]);
        auVar18[0xb] = -(local_88[0xb] == local_e8[0xb]);
        auVar18[0xc] = -(local_88[0xc] == local_e8[0xc]);
        auVar18[0xd] = -(local_88[0xd] == local_e8[0xd]);
        auVar18[0xe] = -(local_88[0xe] == local_e8[0xe]);
        auVar18[0xf] = -(local_88[0xf] == local_e8[0xf]);
        auVar18 = auVar18 & auVar21;
        if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) {
          hash = (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                  *)local_3e8;
          ApplyStats((CCoinsStats *)local_7b8,(uint256 *)local_3e8,outputs_05);
          ApplyHash<decltype(nullptr)>((void **)local_3e8,(Txid *)hash,outputs_06);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
          ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                   *)local_3e8);
        }
      }
      local_e8[0x10] = local_78[0];
      local_e8[0x11] = local_78[1];
      local_e8[0x12] = local_78[2];
      local_e8[0x13] = local_78[3];
      local_e8[0x14] = local_78[4];
      local_e8[0x15] = local_78[5];
      local_e8[0x16] = local_78[6];
      local_e8[0x17] = local_78[7];
      local_e8[0x18] = local_78[8];
      local_e8[0x19] = local_78[9];
      local_e8[0x1a] = local_78[10];
      local_e8[0x1b] = local_78[0xb];
      local_e8[0x1c] = local_78[0xc];
      local_e8[0x1d] = local_78[0xd];
      local_e8[0x1e] = local_78[0xe];
      local_e8[0x1f] = local_78[0xf];
      local_e8._0_16_ = local_88;
      pmVar7 = std::
               map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
               ::operator[]((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                             *)local_3e8,(key_type_conflict3 *)&local_68);
      (pmVar7->out).nValue = local_6e8._0_8_;
      pCVar14 = &(pmVar7->out).scriptPubKey;
      if (0x1c < (pmVar7->out).scriptPubKey.super_CScriptBase._size) {
        free((pCVar14->super_CScriptBase)._union.indirect_contents.indirect);
      }
      *(ulong *)((long)&(pmVar7->out).scriptPubKey.super_CScriptBase._union + 0xc) =
           CONCAT44(local_6e8._24_4_,local_6e8._20_4_);
      *(ulong *)((long)&(pmVar7->out).scriptPubKey.super_CScriptBase._union + 0x14) =
           CONCAT44(local_6e8._32_4_,local_6e8._28_4_);
      (pCVar14->super_CScriptBase)._union.indirect_contents.indirect = (char *)local_6e8._8_8_;
      *(ulong *)((long)&(pmVar7->out).scriptPubKey.super_CScriptBase._union + 8) =
           CONCAT44(local_6e8._20_4_,local_6e8._16_4_);
      (pmVar7->out).scriptPubKey.super_CScriptBase._size = sStack_6c4;
      sStack_6c4 = 0;
      pmVar7->field_0x28 = auStack_6c0[0];
      pmVar7->field_0x29 = auStack_6c0[1];
      pmVar7->field_0x2a = auStack_6c0[2];
      pmVar7->field_0x2b = auStack_6c0[3];
      local_740 = local_740 + 1;
      (**(code **)(*(long *)local_b8._0_8_ + 0x28))();
      if (0x1c < sStack_6c4) {
        free((void *)local_6e8._8_8_);
        local_6e8._8_8_ = 0;
      }
    }
    if (local_3c0 != 0) {
      hash_00 = (Txid *)local_3e8;
      ApplyStats((CCoinsStats *)local_7b8,(uint256 *)local_3e8,outputs_04);
      ApplyHash<decltype(nullptr)>((void **)local_3e8,hash_00,outputs_07);
    }
    local_758 = (**(code **)(*plVar9 + 0x40))();
LAB_008c9e72:
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                 *)local_3e8);
    local_7c0 = (long *)local_b8._0_8_;
  }
  else {
    if (iVar10 == 1) {
      plVar22 = plVar9;
      MuHash3072::MuHash3072((MuHash3072 *)local_6e8);
      memcpy(local_3e8,(MuHash3072 *)local_6e8,0x300);
      (**(code **)(*plVar9 + 0x28))(&local_7c0,plVar9);
      if (local_7c0 == (long *)0x0) {
        pcVar13 = 
        "bool kernel::ComputeUTXOStats(CCoinsView *, CCoinsStats &, T, const std::function<void ()> &) [T = MuHash3072]"
        ;
        goto LAB_008ca000;
      }
      local_48 = (undefined1  [16])0x0;
      local_58 = (undefined1  [16])0x0;
      local_68 = (_Base_ptr)(local_88 + 8);
      local_88._8_4_ = 0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_68;
      local_78 = auVar3 << 0x40;
      local_60 = 0;
      while (cVar4 = (**(code **)(*local_7c0 + 0x20))(), cVar4 != '\0') {
        if (*(long *)((long)&(blockman->cs_LastBlockFile).super_recursive_mutex.
                             super___recursive_mutex_base._M_mutex + 0x10) != 0) {
          (**(code **)((long)&(blockman->cs_LastBlockFile).super_recursive_mutex.
                              super___recursive_mutex_base._M_mutex + 0x18))(blockman);
        }
        local_a8 = (undefined1  [16])0x0;
        local_b8 = (undefined1  [16])0x0;
        local_98[0] = 0xffffffff;
        CTxOut::CTxOut((CTxOut *)local_e8);
        local_c0 = 0;
        cVar5 = (**(code **)(*local_7c0 + 0x10))(local_7c0,local_b8);
        iVar10 = (int)pcVar13;
        if (cVar5 == '\0') {
LAB_008c9d06:
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/coinstats.cpp"
          ;
          source_file._M_len = 0x5d;
          logging_function._M_str = "ComputeUTXOStats";
          logging_function._M_len = 0x10;
          LogPrintf_<char[17]>
                    (logging_function,source_file,iVar10,(LogFlags)interruption_point,(Level)plVar22
                     ,(char *)__return_storage_ptr__,(char (*) [17])args);
          goto LAB_008c9d8b;
        }
        cVar5 = (**(code **)(*local_7c0 + 0x18))(local_7c0,(CTxOut *)local_e8);
        iVar10 = (int)pcVar13;
        if (cVar5 == '\0') goto LAB_008c9d06;
        if (local_60 != 0) {
          auVar20[0] = -(local_a8[0] == local_48[0]);
          auVar20[1] = -(local_a8[1] == local_48[1]);
          auVar20[2] = -(local_a8[2] == local_48[2]);
          auVar20[3] = -(local_a8[3] == local_48[3]);
          auVar20[4] = -(local_a8[4] == local_48[4]);
          auVar20[5] = -(local_a8[5] == local_48[5]);
          auVar20[6] = -(local_a8[6] == local_48[6]);
          auVar20[7] = -(local_a8[7] == local_48[7]);
          auVar20[8] = -(local_a8[8] == local_48[8]);
          auVar20[9] = -(local_a8[9] == local_48[9]);
          auVar20[10] = -(local_a8[10] == local_48[10]);
          auVar20[0xb] = -(local_a8[0xb] == local_48[0xb]);
          auVar20[0xc] = -(local_a8[0xc] == local_48[0xc]);
          auVar20[0xd] = -(local_a8[0xd] == local_48[0xd]);
          auVar20[0xe] = -(local_a8[0xe] == local_48[0xe]);
          auVar20[0xf] = -(local_a8[0xf] == local_48[0xf]);
          auVar17[0] = -(local_b8[0] == local_58[0]);
          auVar17[1] = -(local_b8[1] == local_58[1]);
          auVar17[2] = -(local_b8[2] == local_58[2]);
          auVar17[3] = -(local_b8[3] == local_58[3]);
          auVar17[4] = -(local_b8[4] == local_58[4]);
          auVar17[5] = -(local_b8[5] == local_58[5]);
          auVar17[6] = -(local_b8[6] == local_58[6]);
          auVar17[7] = -(local_b8[7] == local_58[7]);
          auVar17[8] = -(local_b8[8] == local_58[8]);
          auVar17[9] = -(local_b8[9] == local_58[9]);
          auVar17[10] = -(local_b8[10] == local_58[10]);
          auVar17[0xb] = -(local_b8[0xb] == local_58[0xb]);
          auVar17[0xc] = -(local_b8[0xc] == local_58[0xc]);
          auVar17[0xd] = -(local_b8[0xd] == local_58[0xd]);
          auVar17[0xe] = -(local_b8[0xe] == local_58[0xe]);
          auVar17[0xf] = -(local_b8[0xf] == local_58[0xf]);
          auVar17 = auVar17 & auVar20;
          if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff) {
            ApplyStats((CCoinsStats *)local_7b8,(uint256 *)local_88,outputs_03);
            ApplyHash<MuHash3072>
                      ((MuHash3072 *)local_3e8,(Txid *)local_58,
                       (map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                        *)local_88);
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
            ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                     *)local_88);
          }
        }
        local_48 = local_a8;
        local_58 = local_b8;
        pmVar7 = std::
                 map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                 ::operator[]((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                               *)local_88,local_98);
        (pmVar7->out).nValue = local_e8._0_8_;
        pCVar14 = &(pmVar7->out).scriptPubKey;
        if (0x1c < (pmVar7->out).scriptPubKey.super_CScriptBase._size) {
          free((pCVar14->super_CScriptBase)._union.indirect_contents.indirect);
        }
        *(ulong *)((long)&(pmVar7->out).scriptPubKey.super_CScriptBase._union + 0xc) =
             CONCAT17(local_e8[0x1b],
                      CONCAT16(local_e8[0x1a],
                               CONCAT15(local_e8[0x19],
                                        CONCAT14(local_e8[0x18],
                                                 CONCAT13(local_e8[0x17],
                                                          CONCAT12(local_e8[0x16],
                                                                   CONCAT11(local_e8[0x15],
                                                                            local_e8[0x14])))))));
        *(ulong *)((long)&(pmVar7->out).scriptPubKey.super_CScriptBase._union + 0x14) =
             CONCAT44(local_e8._32_4_,
                      CONCAT13(local_e8[0x1f],
                               CONCAT12(local_e8[0x1e],CONCAT11(local_e8[0x1d],local_e8[0x1c]))));
        (pCVar14->super_CScriptBase)._union.indirect_contents.indirect = (char *)local_e8._8_8_;
        *(ulong *)((long)&(pmVar7->out).scriptPubKey.super_CScriptBase._union + 8) =
             CONCAT17(local_e8[0x17],
                      CONCAT16(local_e8[0x16],
                               CONCAT15(local_e8[0x15],
                                        CONCAT14(local_e8[0x14],
                                                 CONCAT13(local_e8[0x13],
                                                          CONCAT12(local_e8[0x12],
                                                                   CONCAT11(local_e8[0x11],
                                                                            local_e8[0x10])))))));
        (pmVar7->out).scriptPubKey.super_CScriptBase._size = local_c4;
        local_c4 = 0;
        *(undefined4 *)&pmVar7->field_0x28 = local_c0;
        local_740 = local_740 + 1;
        (**(code **)(*local_7c0 + 0x28))();
        if (0x1c < local_c4) {
          free((void *)local_e8._8_8_);
          local_e8._8_8_ = 0;
        }
      }
      if (local_60 != 0) {
        ApplyStats((CCoinsStats *)local_7b8,(uint256 *)local_88,outputs_02);
        ApplyHash<MuHash3072>
                  ((MuHash3072 *)local_3e8,(Txid *)local_58,
                   (map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                    *)local_88);
      }
      local_e8[0x10] = '\0';
      local_e8[0x11] = '\0';
      local_e8[0x12] = '\0';
      local_e8[0x13] = '\0';
      local_e8[0x14] = '\0';
      local_e8[0x15] = '\0';
      local_e8[0x16] = '\0';
      local_e8[0x17] = '\0';
      local_e8[0x18] = '\0';
      local_e8[0x19] = '\0';
      local_e8[0x1a] = '\0';
      local_e8[0x1b] = '\0';
      local_e8[0x1c] = '\0';
      local_e8[0x1d] = '\0';
      local_e8[0x1e] = '\0';
      local_e8[0x1f] = '\0';
      local_e8._0_16_ = (undefined1  [16])0x0;
      MuHash3072::Finalize((MuHash3072 *)local_3e8,(uint256 *)local_e8);
      local_768[1] = local_e8[0x11];
      local_768[0] = local_e8[0x10];
      local_768[2] = local_e8[0x12];
      local_768[3] = local_e8[0x13];
      local_768[4] = local_e8[0x14];
      local_768[5] = local_e8[0x15];
      local_768[6] = local_e8[0x16];
      local_768[7] = local_e8[0x17];
      auStack_760[1] = local_e8[0x19];
      auStack_760[0] = local_e8[0x18];
      auStack_760[2] = local_e8[0x1a];
      auStack_760[3] = local_e8[0x1b];
      auStack_760[4] = local_e8[0x1c];
      auStack_760[5] = local_e8[0x1d];
      auStack_760[6] = local_e8[0x1e];
      auStack_760[7] = local_e8[0x1f];
      local_7b8._64_8_ = local_e8._0_8_;
      local_7b8._72_8_ = local_e8._8_8_;
      local_758 = (**(code **)(*plVar22 + 0x40))();
    }
    else {
      if (iVar10 != 0) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/coinstats.cpp"
                      ,0xad,
                      "auto kernel::ComputeUTXOStats(CoinStatsHashType, CCoinsView *, node::BlockManager &, const std::function<void ()> &)::(anonymous class)::operator()() const"
                     );
      }
      local_698 = (undefined1  [16])0x0;
      local_6a8 = (undefined1  [16])0x0;
      local_6b8 = (undefined1  [16])0x0;
      local_6e8[0x20] = '\0';
      local_6e8[0x21] = '\0';
      local_6e8[0x22] = '\0';
      local_6e8[0x23] = '\0';
      sStack_6c4 = 0;
      auStack_6c0[0] = '\0';
      auStack_6c0[1] = '\0';
      auStack_6c0[2] = '\0';
      auStack_6c0[3] = '\0';
      auStack_6c0[4] = '\0';
      auStack_6c0[5] = '\0';
      auStack_6c0[6] = '\0';
      auStack_6c0[7] = '\0';
      local_6e8._16_4_ = 0;
      local_6e8._20_4_ = 0;
      local_6e8._24_4_ = 0;
      local_6e8._28_4_ = 0;
      local_6e8._0_8_ = (mutex_type *)0x0;
      local_6e8[8] = false;
      local_6e8._9_7_ = 0;
      local_688 = 0;
      plVar22 = plVar9;
      CSHA256::CSHA256((CSHA256 *)local_6e8);
      pCVar11 = (CSHA256 *)local_6e8;
      puVar12 = (undefined8 *)local_3e8;
      for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar12 = *(undefined8 *)pCVar11->s;
        pCVar11 = (CSHA256 *)((long)pCVar11 + (ulong)bVar15 * -0x10 + 8);
        puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
      }
      (**(code **)(*plVar9 + 0x28))(&local_7c0,plVar9);
      if (local_7c0 == (long *)0x0) {
        pcVar13 = 
        "bool kernel::ComputeUTXOStats(CCoinsView *, CCoinsStats &, T, const std::function<void ()> &) [T = HashWriter]"
        ;
LAB_008ca000:
        __assert_fail("pcursor",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/coinstats.cpp"
                      ,0x77,pcVar13);
      }
      local_48 = (undefined1  [16])0x0;
      local_58 = (undefined1  [16])0x0;
      local_68 = (_Base_ptr)(local_88 + 8);
      local_88._8_4_ = 0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_68;
      local_78 = auVar2 << 0x40;
      local_60 = 0;
      while (cVar4 = (**(code **)(*local_7c0 + 0x20))(), cVar4 != '\0') {
        if (*(long *)((long)&(blockman->cs_LastBlockFile).super_recursive_mutex.
                             super___recursive_mutex_base._M_mutex + 0x10) != 0) {
          (**(code **)((long)&(blockman->cs_LastBlockFile).super_recursive_mutex.
                              super___recursive_mutex_base._M_mutex + 0x18))(blockman);
        }
        local_a8 = (undefined1  [16])0x0;
        local_b8 = (undefined1  [16])0x0;
        local_98[0] = 0xffffffff;
        CTxOut::CTxOut((CTxOut *)local_e8);
        local_c0 = 0;
        cVar5 = (**(code **)(*local_7c0 + 0x10))(local_7c0,local_b8);
        iVar10 = (int)pcVar13;
        if (cVar5 == '\0') {
LAB_008c9d6e:
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/coinstats.cpp"
          ;
          source_file_01._M_len = 0x5d;
          logging_function_01._M_str = "ComputeUTXOStats";
          logging_function_01._M_len = 0x10;
          LogPrintf_<char[17]>
                    (logging_function_01,source_file_01,iVar10,(LogFlags)interruption_point,
                     (Level)plVar22,(char *)__return_storage_ptr__,(char (*) [17])args);
LAB_008c9d8b:
          if (0x1c < local_c4) {
            free((void *)local_e8._8_8_);
            local_e8._8_8_ = 0;
          }
          goto LAB_008c9f09;
        }
        cVar5 = (**(code **)(*local_7c0 + 0x18))(local_7c0,(CTxOut *)local_e8);
        iVar10 = (int)pcVar13;
        if (cVar5 == '\0') goto LAB_008c9d6e;
        if (local_60 != 0) {
          auVar19[0] = -(local_a8[0] == local_48[0]);
          auVar19[1] = -(local_a8[1] == local_48[1]);
          auVar19[2] = -(local_a8[2] == local_48[2]);
          auVar19[3] = -(local_a8[3] == local_48[3]);
          auVar19[4] = -(local_a8[4] == local_48[4]);
          auVar19[5] = -(local_a8[5] == local_48[5]);
          auVar19[6] = -(local_a8[6] == local_48[6]);
          auVar19[7] = -(local_a8[7] == local_48[7]);
          auVar19[8] = -(local_a8[8] == local_48[8]);
          auVar19[9] = -(local_a8[9] == local_48[9]);
          auVar19[10] = -(local_a8[10] == local_48[10]);
          auVar19[0xb] = -(local_a8[0xb] == local_48[0xb]);
          auVar19[0xc] = -(local_a8[0xc] == local_48[0xc]);
          auVar19[0xd] = -(local_a8[0xd] == local_48[0xd]);
          auVar19[0xe] = -(local_a8[0xe] == local_48[0xe]);
          auVar19[0xf] = -(local_a8[0xf] == local_48[0xf]);
          auVar16[0] = -(local_b8[0] == local_58[0]);
          auVar16[1] = -(local_b8[1] == local_58[1]);
          auVar16[2] = -(local_b8[2] == local_58[2]);
          auVar16[3] = -(local_b8[3] == local_58[3]);
          auVar16[4] = -(local_b8[4] == local_58[4]);
          auVar16[5] = -(local_b8[5] == local_58[5]);
          auVar16[6] = -(local_b8[6] == local_58[6]);
          auVar16[7] = -(local_b8[7] == local_58[7]);
          auVar16[8] = -(local_b8[8] == local_58[8]);
          auVar16[9] = -(local_b8[9] == local_58[9]);
          auVar16[10] = -(local_b8[10] == local_58[10]);
          auVar16[0xb] = -(local_b8[0xb] == local_58[0xb]);
          auVar16[0xc] = -(local_b8[0xc] == local_58[0xc]);
          auVar16[0xd] = -(local_b8[0xd] == local_58[0xd]);
          auVar16[0xe] = -(local_b8[0xe] == local_58[0xe]);
          auVar16[0xf] = -(local_b8[0xf] == local_58[0xf]);
          auVar16 = auVar16 & auVar19;
          if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff) {
            ApplyStats((CCoinsStats *)local_7b8,(uint256 *)local_88,outputs_01);
            ApplyHash<HashWriter>
                      ((HashWriter *)local_3e8,(Txid *)local_58,
                       (map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                        *)local_88);
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
            ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                     *)local_88);
          }
        }
        local_48 = local_a8;
        local_58 = local_b8;
        pmVar7 = std::
                 map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                 ::operator[]((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                               *)local_88,local_98);
        (pmVar7->out).nValue = local_e8._0_8_;
        pCVar14 = &(pmVar7->out).scriptPubKey;
        if (0x1c < (pmVar7->out).scriptPubKey.super_CScriptBase._size) {
          free((pCVar14->super_CScriptBase)._union.indirect_contents.indirect);
        }
        *(ulong *)((long)&(pmVar7->out).scriptPubKey.super_CScriptBase._union + 0xc) =
             CONCAT17(local_e8[0x1b],
                      CONCAT16(local_e8[0x1a],
                               CONCAT15(local_e8[0x19],
                                        CONCAT14(local_e8[0x18],
                                                 CONCAT13(local_e8[0x17],
                                                          CONCAT12(local_e8[0x16],
                                                                   CONCAT11(local_e8[0x15],
                                                                            local_e8[0x14])))))));
        *(ulong *)((long)&(pmVar7->out).scriptPubKey.super_CScriptBase._union + 0x14) =
             CONCAT44(local_e8._32_4_,
                      CONCAT13(local_e8[0x1f],
                               CONCAT12(local_e8[0x1e],CONCAT11(local_e8[0x1d],local_e8[0x1c]))));
        (pCVar14->super_CScriptBase)._union.indirect_contents.indirect = (char *)local_e8._8_8_;
        *(ulong *)((long)&(pmVar7->out).scriptPubKey.super_CScriptBase._union + 8) =
             CONCAT17(local_e8[0x17],
                      CONCAT16(local_e8[0x16],
                               CONCAT15(local_e8[0x15],
                                        CONCAT14(local_e8[0x14],
                                                 CONCAT13(local_e8[0x13],
                                                          CONCAT12(local_e8[0x12],
                                                                   CONCAT11(local_e8[0x11],
                                                                            local_e8[0x10])))))));
        (pmVar7->out).scriptPubKey.super_CScriptBase._size = local_c4;
        local_c4 = 0;
        *(undefined4 *)&pmVar7->field_0x28 = local_c0;
        local_740 = local_740 + 1;
        (**(code **)(*local_7c0 + 0x28))();
        if (0x1c < local_c4) {
          free((void *)local_e8._8_8_);
          local_e8._8_8_ = 0;
        }
      }
      if (local_60 != 0) {
        ApplyStats((CCoinsStats *)local_7b8,(uint256 *)local_88,outputs_00);
        ApplyHash<HashWriter>
                  ((HashWriter *)local_3e8,(Txid *)local_58,
                   (map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                    *)local_88);
      }
      HashWriter::GetHash((uint256 *)local_e8,(HashWriter *)local_3e8);
      local_768[1] = local_e8[0x11];
      local_768[0] = local_e8[0x10];
      local_768[2] = local_e8[0x12];
      local_768[3] = local_e8[0x13];
      local_768[4] = local_e8[0x14];
      local_768[5] = local_e8[0x15];
      local_768[6] = local_e8[0x16];
      local_768[7] = local_e8[0x17];
      auStack_760[1] = local_e8[0x19];
      auStack_760[0] = local_e8[0x18];
      auStack_760[2] = local_e8[0x1a];
      auStack_760[3] = local_e8[0x1b];
      auStack_760[4] = local_e8[0x1c];
      auStack_760[5] = local_e8[0x1d];
      auStack_760[6] = local_e8[0x1e];
      auStack_760[7] = local_e8[0x1f];
      local_7b8._64_8_ = local_e8._0_8_;
      local_7b8._72_8_ = local_e8._8_8_;
      local_758 = (**(code **)(*plVar22 + 0x40))();
    }
LAB_008c9f09:
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                 *)local_88);
  }
  if (local_7c0 != (long *)0x0) {
    (**(code **)(*local_7c0 + 8))();
  }
  if (cVar4 == '\0') {
    memcpy(__return_storage_ptr__,local_7b8,0xd0);
  }
  (__return_storage_ptr__->super__Optional_base<kernel::CCoinsStats,_true,_true>)._M_payload.
  super__Optional_payload_base<kernel::CCoinsStats>._M_engaged = cVar4 == '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<CCoinsStats> ComputeUTXOStats(CoinStatsHashType hash_type, CCoinsView* view, node::BlockManager& blockman, const std::function<void()>& interruption_point)
{
    CBlockIndex* pindex = WITH_LOCK(::cs_main, return blockman.LookupBlockIndex(view->GetBestBlock()));
    CCoinsStats stats{Assert(pindex)->nHeight, pindex->GetBlockHash()};

    bool success = [&]() -> bool {
        switch (hash_type) {
        case(CoinStatsHashType::HASH_SERIALIZED): {
            HashWriter ss{};
            return ComputeUTXOStats(view, stats, ss, interruption_point);
        }
        case(CoinStatsHashType::MUHASH): {
            MuHash3072 muhash;
            return ComputeUTXOStats(view, stats, muhash, interruption_point);
        }
        case(CoinStatsHashType::NONE): {
            return ComputeUTXOStats(view, stats, nullptr, interruption_point);
        }
        } // no default case, so the compiler can warn about missing cases
        assert(false);
    }();

    if (!success) {
        return std::nullopt;
    }
    return stats;
}